

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulePropertiesDialog.cpp
# Opt level: O2

void __thiscall
ModulePropertiesDialog::ModulePropertiesDialog
          (ModulePropertiesDialog *this,Module *mod,SongListModel *model,QWidget *parent)

{
  anon_class_1_0_00000001 *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  QListView *this_00;
  QPushButton *pQVar5;
  QLineEdit *pQVar6;
  QSpinBox *pQVar7;
  QDialogButtonBox *pQVar8;
  QButtonGroup *pQVar9;
  QVBoxLayout *pQVar10;
  QHBoxLayout *pQVar11;
  QFrame *pQVar12;
  QGroupBox *this_01;
  QRadioButton *this_02;
  QLabel *pQVar13;
  Module *pMVar14;
  offset_in_QItemSelectionModel_to_subr signal;
  undefined4 *puVar15;
  InfoStr *str;
  InfoStr *str_00;
  InfoStr *str_01;
  undefined1 uVar16;
  ConnectionType CVar17;
  ulong uVar18;
  int *piVar19;
  QArrayDataPointer<char16_t> local_138;
  QVBoxLayout *local_120;
  QRadioButton *local_118;
  QRadioButton *local_110;
  QHBoxLayout *local_108;
  QGroupBox *local_100;
  QGroupBox *local_f8;
  Module *local_f0;
  QObject local_e8 [8];
  QObject local_e0 [8];
  Object local_d8 [8];
  Object local_d0 [8];
  Object local_c8 [8];
  Object local_c0 [8];
  Object local_b8 [8];
  Object local_b0 [8];
  Object local_a8 [8];
  Object local_a0 [8];
  Object local_98 [8];
  Object local_90 [8];
  Object local_88 [8];
  Object local_80 [8];
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  QDialog::QDialog(&this->super_QDialog,parent,0x8003000);
  *(undefined ***)this = &PTR_metaObject_001f2d08;
  *(undefined ***)&this->field_0x10 = &PTR__ModulePropertiesDialog_001f2ee0;
  this->mModule = mod;
  this->mModel = model;
  this->mDirty = 0;
  this->mWarnRemove = true;
  local_f0 = mod;
  this_00 = (QListView *)operator_new(0x28);
  QListView::QListView(this_00,(QWidget *)0x0);
  this->mSongList = this_00;
  pQVar5 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_138,"Add",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar5,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  this->mAddButton = pQVar5;
  pQVar5 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_138,"Remove",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar5,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  this->mRemoveButton = pQVar5;
  pQVar5 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_138,"Duplicate",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar5,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  this->mDuplicateButton = pQVar5;
  pQVar5 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_138,"Move up",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar5,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  this->mMoveUpButton = pQVar5;
  pQVar5 = (QPushButton *)operator_new(0x28);
  tr((QString *)&local_138,"Move down",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar5,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  this->mMoveDownButton = pQVar5;
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,(QWidget *)0x0);
  this->mTitleEdit = pQVar6;
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,(QWidget *)0x0);
  this->mArtistEdit = pQVar6;
  pQVar6 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar6,(QWidget *)0x0);
  this->mCopyrightEdit = pQVar6;
  pQVar7 = (QSpinBox *)operator_new(0x28);
  QSpinBox::QSpinBox(pQVar7,(QWidget *)0x0);
  this->mCustomSpin = pQVar7;
  pQVar8 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar8,0x400400,0);
  this->mDialogButtons = pQVar8;
  pQVar9 = (QButtonGroup *)operator_new(0x10);
  QButtonGroup::QButtonGroup(pQVar9,(QObject *)this);
  this->mFramerateRadios = pQVar9;
  QDialog::setModal(SUB81(this,0));
  tr((QString *)&local_138,"Module properties",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  pQVar10 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar10);
  local_f8 = (QGroupBox *)operator_new(0x28);
  tr((QString *)&local_138,"Song list",(char *)0x0,-1);
  local_120 = pQVar10;
  QGroupBox::QGroupBox(local_f8,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  pQVar11 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar11);
  (**(code **)(*(long *)this->mSongList + 0x1c8))(this->mSongList,model);
  pQVar10 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar10);
  QBoxLayout::addWidget(pQVar10,this->mAddButton,0,0);
  QBoxLayout::addWidget(pQVar10,this->mRemoveButton,0,0);
  QBoxLayout::addWidget(pQVar10,this->mDuplicateButton,0,0);
  pQVar12 = (QFrame *)operator_new(0x28);
  QFrame::QFrame(pQVar12,0,0);
  QFrame::setFrameShape((Shadow)pQVar12);
  QFrame::setFrameShadow((Shadow)pQVar12);
  QBoxLayout::addWidget(pQVar10,pQVar12,0,0);
  QBoxLayout::addWidget(pQVar10,this->mMoveUpButton,0,0);
  QBoxLayout::addWidget(pQVar10,this->mMoveDownButton,0,0);
  QBoxLayout::addStretch((int)pQVar10);
  QBoxLayout::addWidget(pQVar11,this->mSongList,1,0);
  QBoxLayout::addLayout((QLayout *)pQVar11,(int)pQVar10);
  QWidget::setLayout((QLayout *)local_f8);
  local_108 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(local_108);
  local_100 = (QGroupBox *)operator_new(0x28);
  tr((QString *)&local_138,"Information",(char *)0x0,-1);
  QGroupBox::QGroupBox(local_100,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  pQVar10 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar10);
  QBoxLayout::addWidget(pQVar10,this->mTitleEdit,0,0);
  QBoxLayout::addWidget(pQVar10,this->mArtistEdit,0,0);
  QBoxLayout::addWidget(pQVar10,this->mCopyrightEdit,0,0);
  QWidget::setLayout((QLayout *)local_100);
  this_01 = (QGroupBox *)operator_new(0x28);
  tr((QString *)&local_138,"Framerate",(char *)0x0,-1);
  QGroupBox::QGroupBox(this_01,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  pQVar10 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar10);
  local_110 = (QRadioButton *)operator_new(0x28);
  tr((QString *)&local_138,"DMG (59.7 Hz)",(char *)0x0,-1);
  QRadioButton::QRadioButton(local_110,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  local_118 = (QRadioButton *)operator_new(0x28);
  tr((QString *)&local_138,"SGB (61.1 Hz)",(char *)0x0,-1);
  QRadioButton::QRadioButton(local_118,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  pQVar11 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar11);
  this_02 = (QRadioButton *)operator_new(0x28);
  tr((QString *)&local_138,"Custom",(char *)0x0,-1);
  QRadioButton::QRadioButton(this_02,(QString *)&local_138,(QWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QSpinBox::setRange((int)this->mCustomSpin,0xf);
  pQVar7 = this->mCustomSpin;
  tr((QString *)&local_138," Hz",(char *)0x0,-1);
  QSpinBox::setSuffix((QString *)pQVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QBoxLayout::addWidget(pQVar11,this_02,0,0);
  QBoxLayout::addWidget(pQVar11,this->mCustomSpin,0,0);
  QBoxLayout::addStretch((int)pQVar11);
  QBoxLayout::addWidget(pQVar10,local_110,0,0);
  QBoxLayout::addWidget(pQVar10,local_118,0,0);
  QBoxLayout::addLayout((QLayout *)pQVar10,(int)pQVar11);
  QWidget::setLayout((QLayout *)this_01);
  QBoxLayout::addWidget(local_108,local_100,1,0);
  QBoxLayout::addWidget(local_108,this_01,0,0);
  QBoxLayout::addWidget(local_120,local_f8,1,0);
  QBoxLayout::addLayout((QLayout *)local_120,(int)local_108);
  pQVar13 = (QLabel *)operator_new(0x28);
  tr((QString *)&local_48,"Module revision: %1.%2",(char *)0x0,-1);
  pMVar14 = Module::data(local_f0);
  iVar3 = trackerboy::Module::revisionMajor(pMVar14);
  QString::number((int)&local_60,iVar3);
  pMVar14 = Module::data(local_f0);
  iVar3 = trackerboy::Module::revisionMinor(pMVar14);
  QString::number((int)&local_78,iVar3);
  QString::arg<QString,QString>
            ((type *)&local_138,(QString *)&local_48,(QString *)&local_60,(QString *)&local_78);
  QLabel::QLabel(pQVar13,&local_138,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  bVar2 = (bool)QDialogButtonBox::button((StandardButton)this->mDialogButtons);
  QWidget::setEnabled(bVar2);
  local_138.d = (Data *)0x1b9;
  local_138.ptr = (char16_t *)0x0;
  CVar17 = (ConnectionType)this;
  QObject::connect<void(QDialogButtonBox::*)(),void(ModulePropertiesDialog::*)()>
            (local_80,(offset_in_QDialogButtonBox_to_subr)this->mDialogButtons,
             (Object *)QDialogButtonBox::accepted,0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_80);
  local_138.d = (Data *)0x1c1;
  local_138.ptr = (char16_t *)0x0;
  QObject::connect<void(QDialogButtonBox::*)(),void(QDialog::*)()>
            (local_88,(offset_in_QDialogButtonBox_to_subr)this->mDialogButtons,
             (Object *)QDialogButtonBox::rejected,0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QBoxLayout::addWidget(local_120,pQVar13,0,0);
  QBoxLayout::addWidget(local_120,this->mDialogButtons,0,0);
  QLayout::setSizeConstraint((SizeConstraint)local_120);
  QWidget::setLayout((QLayout *)this);
  pQVar6 = this->mTitleEdit;
  tr((QString *)&local_138,"Title",(char *)0x0,-1);
  QLineEdit::setPlaceholderText((QString *)pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  pQVar6 = this->mArtistEdit;
  tr((QString *)&local_138,"Artist",(char *)0x0,-1);
  QLineEdit::setPlaceholderText((QString *)pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  pQVar6 = this->mCopyrightEdit;
  tr((QString *)&local_138,"Copyright",(char *)0x0,-1);
  QLineEdit::setPlaceholderText((QString *)pQVar6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  signal = QAbstractItemView::selectionModel();
  local_138.d = (Data *)updateSongButtons;
  local_138.ptr = (char16_t *)0x0;
  QObject::
  connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(ModulePropertiesDialog::*)()>
            (local_90,signal,(Object *)QItemSelectionModel::selectionChanged,0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  pMVar14 = Module::data(this->mModule);
  paVar1 = (anon_class_1_0_00000001 *)this->mTitleEdit;
  pQVar6 = (QLineEdit *)trackerboy::Module::title(pMVar14);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(paVar1,pQVar6,str);
  paVar1 = (anon_class_1_0_00000001 *)this->mArtistEdit;
  pQVar6 = (QLineEdit *)trackerboy::Module::artist(pMVar14);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(paVar1,pQVar6,str_00);
  paVar1 = (anon_class_1_0_00000001 *)this->mCopyrightEdit;
  pQVar6 = (QLineEdit *)trackerboy::Module::copyright(pMVar14);
  ModulePropertiesDialog::anon_class_1_0_00000001::operator()(paVar1,pQVar6,str_01);
  uVar4 = trackerboy::Module::system(pMVar14,(char *)pQVar6);
  uVar16 = SUB81(local_110,0);
  if ((char)uVar4 != '\0') {
    uVar16 = SUB81(local_118,0);
    if ((uVar4 & 0xff) != 1) {
      if ((uVar4 & 0xff) != 2) goto LAB_0015c85b;
      uVar16 = SUB81(this_02,0);
    }
  }
  QAbstractButton::setChecked((bool)uVar16);
LAB_0015c85b:
  pQVar7 = this->mCustomSpin;
  trackerboy::Module::customFramerate(pMVar14);
  QSpinBox::setValue((int)pQVar7);
  pQVar7 = this->mCustomSpin;
  QAbstractButton::isChecked();
  QWidget::setEnabled(SUB81(pQVar7,0));
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)local_110);
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)local_118);
  QButtonGroup::addButton((QAbstractButton *)this->mFramerateRadios,(int)this_02);
  updateSongButtons(this);
  local_138.d = (Data *)add;
  local_138.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_98,(offset_in_QAbstractButton_to_subr)this->mAddButton,
             (Object *)QAbstractButton::clicked,0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  local_138.d = (Data *)remove;
  local_138.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_a0,(offset_in_QAbstractButton_to_subr)this->mRemoveButton,
             (Object *)QAbstractButton::clicked,0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  local_138.d = (Data *)duplicate;
  local_138.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_a8,(offset_in_QAbstractButton_to_subr)this->mDuplicateButton,
             (Object *)QAbstractButton::clicked,0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  local_138.d = (Data *)moveUp;
  local_138.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_b0,(offset_in_QAbstractButton_to_subr)this->mMoveUpButton,
             (Object *)QAbstractButton::clicked,0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  local_138.d = (Data *)moveDown;
  local_138.ptr = (char16_t *)0x0;
  QObject::connect<void(QAbstractButton::*)(bool),void(ModulePropertiesDialog::*)()>
            (local_b8,(offset_in_QAbstractButton_to_subr)this->mMoveDownButton,
             (Object *)QAbstractButton::clicked,0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  local_138.d = (Data *)QWidget::setEnabled;
  local_138.ptr = (char16_t *)0x0;
  uVar18 = 0;
  CVar17 = (ConnectionType)this->mCustomSpin;
  QObject::connect<void(QAbstractButton::*)(bool),void(QWidget::*)(bool)>
            (local_c0,(offset_in_QAbstractButton_to_subr)this_02,(Object *)QAbstractButton::toggled,
             0,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QObject::
  connect<void(QLineEdit::*)(QString_const&),ModulePropertiesDialog::ModulePropertiesDialog(Module&,SongListModel&,QWidget*)::__1>
            (local_c8,(offset_in_QLineEdit_to_subr)this->mTitleEdit,(QObject *)this,
             (anon_class_8_1_8991fb9c_for_function)this,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  QObject::
  connect<void(QLineEdit::*)(QString_const&),ModulePropertiesDialog::ModulePropertiesDialog(Module&,SongListModel&,QWidget*)::__1>
            (local_d0,(offset_in_QLineEdit_to_subr)this->mArtistEdit,(QObject *)this,
             (anon_class_8_1_8991fb9c_for_function)this,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  QObject::
  connect<void(QLineEdit::*)(QString_const&),ModulePropertiesDialog::ModulePropertiesDialog(Module&,SongListModel&,QWidget*)::__1>
            (local_d8,(offset_in_QLineEdit_to_subr)this->mCopyrightEdit,(QObject *)this,
             (anon_class_8_1_8991fb9c_for_function)this,CVar17);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  pQVar9 = this->mFramerateRadios;
  local_138.d = (Data *)QButtonGroup::buttonToggled;
  local_138.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x18);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/ModulePropertiesDialog.cpp:314:27),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ModulePropertiesDialog **)(puVar15 + 4) = this;
  piVar19 = (int *)(uVar18 & 0xffffffff00000000);
  QObject::connectImpl
            (local_e0,(void **)pQVar9,(QObject *)&local_138,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar15,piVar19,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  pQVar7 = this->mCustomSpin;
  local_138.d = (Data *)QSpinBox::valueChanged;
  local_138.ptr = (char16_t *)0x0;
  puVar15 = (undefined4 *)operator_new(0x18);
  *puVar15 = 1;
  *(code **)(puVar15 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/ModulePropertiesDialog.cpp:314:27),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(ModulePropertiesDialog **)(puVar15 + 4) = this;
  QObject::connectImpl
            (local_e8,(void **)pQVar7,(QObject *)&local_138,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar15,(int *)((ulong)piVar19 & 0xffffffff00000000),(QMetaObject *)0x0
            );
  QMetaObject::Connection::~Connection((Connection *)local_e8);
  return;
}

Assistant:

ModulePropertiesDialog::ModulePropertiesDialog(Module &mod, SongListModel &model, QWidget *parent) :
    QDialog(parent, Qt::WindowTitleHint | Qt::WindowSystemMenuHint | Qt::WindowCloseButtonHint),
    mModule(mod),
    mModel(model),
    mDirty(Clean),
    mWarnRemove(true),
    mSongList(new QListView),
    mAddButton(new QPushButton(tr("Add"))),
    mRemoveButton(new QPushButton(tr("Remove"))),
    mDuplicateButton(new QPushButton(tr("Duplicate"))),
    mMoveUpButton(new QPushButton(tr("Move up"))),
    mMoveDownButton(new QPushButton(tr("Move down"))),
    mTitleEdit(new QLineEdit),
    mArtistEdit(new QLineEdit),
    mCopyrightEdit(new QLineEdit),
    mCustomSpin(new QSpinBox),
    mDialogButtons(new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel)),
    mFramerateRadios(new QButtonGroup(this))
{
    setModal(true);
    setWindowTitle(tr("Module properties"));


    auto layout = new QVBoxLayout;

    // song list group
    auto songListGroup = new QGroupBox(tr("Song list"));
    auto songListLayout = new QHBoxLayout;
    mSongList->setModel(&model);

    auto songButtonLayout = new QVBoxLayout;
    songButtonLayout->addWidget(mAddButton);
    songButtonLayout->addWidget(mRemoveButton);
    songButtonLayout->addWidget(mDuplicateButton);
    auto line = new QFrame;
    line->setFrameShape(QFrame::HLine);
    line->setFrameShadow(QFrame::Sunken);
    songButtonLayout->addWidget(line);
    songButtonLayout->addWidget(mMoveUpButton);
    songButtonLayout->addWidget(mMoveDownButton);
    songButtonLayout->addStretch();

    songListLayout->addWidget(mSongList, 1);
    songListLayout->addLayout(songButtonLayout);
    songListGroup->setLayout(songListLayout);

    auto propLayout = new QHBoxLayout;

    auto infoGroup = new QGroupBox(tr("Information"));
    auto infoLayout = new QVBoxLayout;
    infoLayout->addWidget(mTitleEdit);
    infoLayout->addWidget(mArtistEdit);
    infoLayout->addWidget(mCopyrightEdit);
    infoGroup->setLayout(infoLayout);

    auto framerateGroup = new QGroupBox(tr("Framerate"));
    auto framerateLayout = new QVBoxLayout;
    auto dmgRadio = new QRadioButton(tr("DMG (59.7 Hz)"));
    auto sgbRadio = new QRadioButton(tr("SGB (61.1 Hz)"));
    auto customLayout = new QHBoxLayout;
    auto customRadio = new QRadioButton(tr("Custom"));
    mCustomSpin->setRange(15, 4096); // theres an issue with < 15 Hz framerates
    mCustomSpin->setSuffix(tr(" Hz"));
    customLayout->addWidget(customRadio);
    customLayout->addWidget(mCustomSpin);
    customLayout->addStretch();
    framerateLayout->addWidget(dmgRadio);
    framerateLayout->addWidget(sgbRadio);
    framerateLayout->addLayout(customLayout);
    framerateGroup->setLayout(framerateLayout);

    propLayout->addWidget(infoGroup, 1);
    propLayout->addWidget(framerateGroup);


    layout->addWidget(songListGroup, 1);
    layout->addLayout(propLayout);
    auto moduleVersionLabel = new QLabel(tr("Module revision: %1.%2").arg(
                                             QString::number(mod.data().revisionMajor()),
                                             QString::number(mod.data().revisionMinor())));

    mDialogButtons->button(QDialogButtonBox::Ok)->setEnabled(false);
    lazyconnect(mDialogButtons, accepted, this, accept);
    lazyconnect(mDialogButtons, rejected, this, reject);

    layout->addWidget(moduleVersionLabel);
    layout->addWidget(mDialogButtons);

    layout->setSizeConstraint(QLayout::SetFixedSize);
    setLayout(layout);


    mTitleEdit->setPlaceholderText(tr("Title"));
    mArtistEdit->setPlaceholderText(tr("Artist"));
    mCopyrightEdit->setPlaceholderText(tr("Copyright"));

    auto selectionModel = mSongList->selectionModel();
    lazyconnect(selectionModel, selectionChanged, this, updateSongButtons);

    auto const& moddata = mModule.data();
    auto setInfoEdit = [](QLineEdit *edit, trackerboy::InfoStr const& str) {
        edit->setMaxLength((int)str.size());
        edit->setText(QString::fromUtf8(str.data(), (int)str.length()));
    };
    setInfoEdit(mTitleEdit, moddata.title());
    setInfoEdit(mArtistEdit, moddata.artist());
    setInfoEdit(mCopyrightEdit, moddata.copyright());

    switch (moddata.system()) {
        case trackerboy::System::dmg:
            dmgRadio->setChecked(true);
            break;
        case trackerboy::System::sgb:
            sgbRadio->setChecked(true);
            break;
        case trackerboy::System::custom:
            customRadio->setChecked(true);
            break;
    }
    mCustomSpin->setValue(moddata.customFramerate());
    mCustomSpin->setEnabled(customRadio->isChecked());



    mFramerateRadios->addButton(dmgRadio, (int)trackerboy::System::dmg);
    mFramerateRadios->addButton(sgbRadio, (int)trackerboy::System::sgb);
    mFramerateRadios->addButton(customRadio, (int)trackerboy::System::custom);


    updateSongButtons();

    lazyconnect(mAddButton, clicked, this, add);
    lazyconnect(mRemoveButton, clicked, this, remove);
    lazyconnect(mDuplicateButton, clicked, this, duplicate);
    lazyconnect(mMoveUpButton, clicked, this, moveUp);
    lazyconnect(mMoveDownButton, clicked, this, moveDown);
    lazyconnect(customRadio, toggled, mCustomSpin, setEnabled);

    auto setInfoDirty = [this]() { setDirty(DirtyInfo); };
    connect(mTitleEdit, &QLineEdit::textChanged, this, setInfoDirty);
    connect(mArtistEdit, &QLineEdit::textChanged, this, setInfoDirty);
    connect(mCopyrightEdit, &QLineEdit::textChanged, this, setInfoDirty);

    auto setSystemDirty = [this]() { setDirty(DirtySystem); };
    connect(mFramerateRadios, qOverload<QAbstractButton*, bool>(&QButtonGroup::buttonToggled), this, setSystemDirty);
    connect(mCustomSpin, qOverload<int>(&QSpinBox::valueChanged), this, setSystemDirty);

}